

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O2

bdConnection * __thiscall
bdConnectManager::findExistingConnectionBySender
          (bdConnectManager *this,bdId *sender,bdId *src,bdId *dest)

{
  bdConnection *pbVar1;
  bdNodeId proxyId;
  bdNodeId local_34;
  
  determineProxyId(this,&sender->id,&src->id,&dest->id,&local_34);
  pbVar1 = findExistingConnection(this,&src->id,&local_34,&dest->id);
  return pbVar1;
}

Assistant:

bdConnection *bdConnectManager::findExistingConnectionBySender(bdId *sender, bdId *src, bdId *dest) {
	bdNodeId proxyId;
	bdNodeId *senderId = &(sender->id);
	bdNodeId *srcId = &(src->id);
	bdNodeId *destId = &(dest->id);
	determineProxyId(senderId, srcId, destId, &proxyId);

	return findExistingConnection(srcId, &proxyId, destId);
}